

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O3

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RealEvaluator::tryEvaluateBinaryPred
          (RealEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  RationalConstantType *pRVar2;
  
  switch(op) {
  case REAL_GREATER:
    pRVar2 = &arg2->super_RationalConstantType;
    arg2 = arg1;
    break;
  case REAL_GREATER_EQUAL:
    pRVar2 = &arg1->super_RationalConstantType;
    arg1 = arg2;
    goto LAB_0053b55f;
  case REAL_LESS:
    pRVar2 = &arg1->super_RationalConstantType;
    break;
  case REAL_LESS_EQUAL:
    pRVar2 = &arg2->super_RationalConstantType;
LAB_0053b55f:
    bVar1 = RationalConstantType::operator>(&arg1->super_RationalConstantType,pRVar2);
    bVar1 = !bVar1;
    goto LAB_0053b566;
  default:
    return false;
  }
  bVar1 = RationalConstantType::operator>(&arg2->super_RationalConstantType,pRVar2);
LAB_0053b566:
  *res = bVar1;
  return true;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::REAL_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::REAL_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::REAL_LESS:
      res = arg1<arg2;
      return true;
    case Theory::REAL_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    default:
      return false;
    }
  }